

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_int(uchar **p,uchar *end,int *val)

{
  byte *pbVar1;
  int iVar2;
  size_t in_RAX;
  uint uVar3;
  bool bVar4;
  size_t local_18;
  
  local_18 = in_RAX;
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_18,2);
  if (iVar2 == 0) {
    iVar2 = -100;
    if ((0xfffffffffffffffb < local_18 - 5) && (pbVar1 = *p, -1 < (char)*pbVar1)) {
      *val = 0;
      iVar2 = 0;
      uVar3 = 0;
      while( true ) {
        bVar4 = local_18 == 0;
        local_18 = local_18 - 1;
        if (bVar4) break;
        uVar3 = uVar3 << 8 | (uint)*pbVar1;
        *val = uVar3;
        *p = pbVar1 + 1;
        pbVar1 = pbVar1 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_int( unsigned char **p,
                  const unsigned char *end,
                  int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( ret );

    if( len == 0 || len > sizeof( int ) || ( **p & 0x80 ) != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = 0;

    while( len-- > 0 )
    {
        *val = ( *val << 8 ) | **p;
        (*p)++;
    }

    return( 0 );
}